

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

nhdp_link * nhdp_db_link_add(nhdp_neighbor *neigh,nhdp_interface *param_2)

{
  list_entity *plVar1;
  list_entity **pplVar2;
  nhdp_link *lnk;
  uint64_t uVar3;
  
  lnk = (nhdp_link *)oonf_class_malloc(&_link_info);
  if (lnk != (nhdp_link *)0x0) {
    lnk->local_if = param_2;
    plVar1 = (param_2->_links).prev;
    (lnk->_if_node).next = &param_2->_links;
    (lnk->_if_node).prev = plVar1;
    (param_2->_links).prev = &lnk->_if_node;
    plVar1->next = &lnk->_if_node;
    plVar1 = (neigh->_links).prev;
    (lnk->_neigh_node).next = &neigh->_links;
    (lnk->_neigh_node).prev = plVar1;
    (neigh->_links).prev = &lnk->_neigh_node;
    plVar1->next = &lnk->_neigh_node;
    lnk->neigh = neigh;
    (lnk->_global_node).next = &_link_list;
    (lnk->_global_node).prev = _link_list.prev;
    pplVar2 = &(_link_list.prev)->next;
    _link_list.prev = &lnk->_global_node;
    *pplVar2 = &lnk->_global_node;
    avl_init(&lnk->_addresses,avl_comp_netaddr,0);
    avl_init(&lnk->_2hop,avl_comp_netaddr,0);
    (lnk->sym_time).class = &_link_symtime_info;
    (lnk->heard_time).class = &_link_heard_info;
    (lnk->vtime).class = &_link_vtime_info;
    (lnk->_originator_node).key = neigh;
    if ((neigh->originator)._type != '\0') {
      avl_insert(&param_2->_link_originators,&lnk->_originator_node);
    }
    uVar3 = oonf_clock_getNow();
    lnk->last_status_change = uVar3;
    nhdp_domain_init_link(lnk);
    oonf_class_event(&_link_info,lnk,OONF_OBJECT_ADDED);
  }
  return lnk;
}

Assistant:

struct nhdp_link *
nhdp_db_link_add(struct nhdp_neighbor *neigh, struct nhdp_interface *local_if) {
  struct nhdp_link *lnk;

  lnk = oonf_class_malloc(&_link_info);
  if (lnk == NULL) {
    return NULL;
  }

  /* hook into interface */
  nhdp_interface_add_link(local_if, lnk);

  /* hook into neighbor */
  list_add_tail(&neigh->_links, &lnk->_neigh_node);
  lnk->neigh = neigh;

  /* hook into global list */
  list_add_tail(&_link_list, &lnk->_global_node);

  /* init local trees */
  avl_init(&lnk->_addresses, avl_comp_netaddr, false);
  avl_init(&lnk->_2hop, avl_comp_netaddr, false);

  /* init timers */
  lnk->sym_time.class = &_link_symtime_info;
  lnk->heard_time.class = &_link_heard_info;
  lnk->vtime.class = &_link_vtime_info;

  /* add to originator tree if set */
  lnk->_originator_node.key = &neigh->originator;
  if (netaddr_get_address_family(&neigh->originator) != AF_UNSPEC) {
    avl_insert(&local_if->_link_originators, &lnk->_originator_node);
  }

  lnk->last_status_change = oonf_clock_getNow();

  /* initialize link domain data */
  nhdp_domain_init_link(lnk);

  /* trigger event */
  oonf_class_event(&_link_info, lnk, OONF_OBJECT_ADDED);

  return lnk;
}